

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O1

void affect_remove_obj(OBJ_DATA *obj,OBJ_AFFECT_DATA *paf,bool show)

{
  short sVar1;
  OBJ_AFFECT_DATA *pOVar2;
  OBJ_AFFECT_DATA *pOVar3;
  string_view fmt;
  string_view fmt_00;
  long vector [2];
  long alStack_28 [2];
  
  if (obj->affected == (OBJ_AFFECT_DATA *)0x0) {
    fmt._M_str = "affect_remove_obj: no affect!";
    fmt._M_len = 0x1d;
    CLogger::Warn<>((CLogger *)&RS.field_0x140,fmt);
    return;
  }
  if (show && paf->end_fun != (OAFF_FUN *)0x0) {
    (*paf->end_fun)(obj,paf);
  }
  affect_modify_obj(obj,paf,false);
  sVar1 = paf->where;
  copy_vector(alStack_28,paf->bitvector);
  pOVar2 = obj->affected;
  if (obj->affected == paf) {
    pOVar3 = (OBJ_AFFECT_DATA *)&obj->affected;
  }
  else {
    do {
      pOVar3 = pOVar2;
      if (pOVar3 == (OBJ_AFFECT_DATA *)0x0) {
        fmt_00._M_str = "affect_remove_obj: cannot find paf on obj #{}!";
        fmt_00._M_len = 0x2e;
        CLogger::Warn<short&>((CLogger *)&RS.field_0x140,fmt_00,&obj->pIndexData->vnum);
        return;
      }
      pOVar2 = pOVar3->next;
    } while (pOVar3->next != paf);
  }
  pOVar3->next = paf->next;
  free_affect_obj(paf);
  affect_check_obj(obj,(int)sVar1,alStack_28);
  return;
}

Assistant:

void affect_remove_obj(OBJ_DATA *obj, OBJ_AFFECT_DATA *paf, bool show)
{
	int where;
	long vector[MAX_BITVECTOR];

	if (!obj->affected)
	{
		RS.Logger.Warn("affect_remove_obj: no affect!");
		return;
	}

	if (paf->end_fun != nullptr && show)
		(*paf->end_fun)(obj, paf);

	affect_modify_obj(obj, paf, false);
	where = paf->where;
	copy_vector(vector, paf->bitvector);

	if (paf == obj->affected)
	{
		obj->affected = paf->next;
	}
	else
	{
		OBJ_AFFECT_DATA *prev;

		for (prev = obj->affected; prev != nullptr; prev = prev->next)
		{
			if (prev->next == paf)
			{
				prev->next = paf->next;
				break;
			}
		}

		if (!prev)
		{
			RS.Logger.Warn("affect_remove_obj: cannot find paf on obj #{}!", obj->pIndexData->vnum);
			return;
		}
	}

	free_affect_obj(paf);
	affect_check_obj(obj, where, vector);
}